

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O3

void kratos::DependencyVisitor::get_var_deps
               (Var *var,
               unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>
               *dep,unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
                    *linked_dep)

{
  VarType VVar1;
  VarSlice *local_28;
  
  do {
    VVar1 = (((VarSlice *)var)->super_Var).type_;
    if (VVar1 != Expression) {
      local_28 = (VarSlice *)var;
      switch(VVar1) {
      case Base:
      case PortIO:
        break;
      default:
        return;
      case Slice:
      case BaseCasted:
        compute_linked_dep((VarSlice *)var,linked_dep);
      }
      std::
      _Hashtable<kratos::Var_const*,kratos::Var_const*,std::allocator<kratos::Var_const*>,std::__detail::_Identity,std::equal_to<kratos::Var_const*>,std::hash<kratos::Var_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::_M_emplace<kratos::Var*&>
                ((_Hashtable<kratos::Var_const*,kratos::Var_const*,std::allocator<kratos::Var_const*>,std::__detail::_Identity,std::equal_to<kratos::Var_const*>,std::hash<kratos::Var_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)dep,&local_28);
      return;
    }
    get_var_deps(*(Var **)&((VarSlice *)var)->low,dep,linked_dep);
    var = *(Var **)&((VarSlice *)var)->var_high_;
  } while ((VarSlice *)var != (VarSlice *)0x0);
  return;
}

Assistant:

void static get_var_deps(
        Var *var, std::unordered_set<const Var *> &dep,
        std::unordered_map<const Var *, std::unordered_map<uint32_t, Var *>> &linked_dep) {
        switch (var->type()) {
            case VarType::Base:
            case VarType::PortIO: {
                dep.emplace(var);
                break;
            }
            case VarType ::Expression: {
                auto const &expr = reinterpret_cast<Expr *>(var);
                get_var_deps(expr->left, dep, linked_dep);
                if (expr->right) {
                    get_var_deps(expr->right, dep, linked_dep);
                }
                break;
            }
            case VarType::BaseCasted:
            case VarType ::Slice: {
                // compute linked dependency
                compute_linked_dep(reinterpret_cast<VarSlice *>(var), linked_dep);
                dep.emplace(var);
                break;
            }
            default: {
                // do nothing
            }
        }
    }